

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::Schema> __thiscall
capnp::compiler::Compiler::Node::resolveBootstrapSchema(Node *this,uint64_t id,Reader brand)

{
  Schema SVar1;
  uint64_t in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  Maybe<capnp::Schema> MVar3;
  Fault f;
  char local_30;
  undefined7 uStack_2f;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar2;
  
  Impl::findNode((Impl *)&stack0xffffffffffffffd0,**(uint64_t **)(id + 8));
  if (CONCAT71(uStack_2f,local_30) == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
              ((Fault *)&stack0xffffffffffffffd0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
               ,0x3ba,FAILED,(char *)0x0,"\"Tried to get schema for ID we haven\'t seen before.\"",
               (char (*) [51])"Tried to get schema for ID we haven\'t seen before.");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffd0);
  }
  MVar3 = getBootstrapSchema((Node *)&stack0xffffffffffffffd0);
  aVar2 = MVar3.ptr.field_1;
  if (local_30 == '\x01') {
    SVar1 = SchemaLoader::get((SchemaLoader *)(**(long **)(id + 8) + 0x188),in_RDX,brand,
                              (Schema)0x277800);
    this->module = (CompiledModule *)SVar1.raw;
    aVar2 = extraout_RDX;
  }
  *(bool *)&(this->super_Resolver)._vptr_Resolver = local_30 == '\x01';
  MVar3.ptr.field_1 = aVar2;
  MVar3.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar3.ptr;
}

Assistant:

kj::Maybe<Schema> Compiler::Node::resolveBootstrapSchema(
    uint64_t id, schema::Brand::Reader brand) {
  KJ_IF_SOME(node, module->getCompiler().findNode(id)) {
    // Make sure the bootstrap schema is loaded into the SchemaLoader.
    if (node.getBootstrapSchema() == kj::none) {
      return kj::none;
    }

    // Now we actually invoke get() to evaluate the brand.
    return module->getCompiler().getWorkspace().bootstrapLoader.get(id, brand);
  } else {
    KJ_FAIL_REQUIRE("Tried to get schema for ID we haven't seen before.");
  }
}